

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O1

int vfio_init(char *pci_addr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  char *pcVar6;
  void *pvVar7;
  int cfd;
  int groupid;
  vfio_group_status group_status;
  char buf [512];
  stat st;
  char iommu_group_path [4096];
  char path [4096];
  int local_22b8;
  uint local_22b4;
  ulong local_22b0;
  undefined1 local_22a8 [512];
  stat local_20a8;
  char local_2018 [4096];
  char local_1018 [4096];
  
  snprintf(local_1018,0x1000,"/sys/bus/pci/devices/%s/",pci_addr);
  iVar1 = stat(local_1018,&local_20a8);
  if (iVar1 < 0) {
    return -1;
  }
  sVar4 = strlen(local_1018);
  strncat(local_1018,"iommu_group",0xfff - sVar4);
  sVar5 = readlink(local_1018,local_2018,0x1000);
  if (sVar5 == -1) {
    vfio_init_cold_11();
LAB_00107714:
    vfio_init_cold_10();
LAB_0010771e:
    vfio_init_cold_8();
LAB_00107728:
    vfio_init_cold_7();
LAB_00107732:
    vfio_init_cold_6();
LAB_0010773c:
    vfio_init_cold_5();
LAB_00107746:
    vfio_init_cold_3();
LAB_00107750:
    vfio_init_cold_9();
LAB_0010775a:
    vfio_init_cold_1();
LAB_00107764:
    vfio_init_cold_2();
  }
  else {
    local_2018[(int)sVar5] = '\0';
    pcVar6 = __xpg_basename(local_2018);
    iVar1 = __isoc99_sscanf(pcVar6,"%d",&local_22b4);
    if (iVar1 == -1) goto LAB_00107714;
    iVar1 = get_vfio_container();
    local_22b8 = iVar1;
    if (iVar1 == -1) {
      iVar2 = open("/dev/vfio/vfio",2);
      if (iVar2 == -1) goto LAB_00107750;
      local_22b8 = iVar2;
      set_vfio_container(iVar2);
      iVar2 = ioctl(local_22b8,0x3b64);
      if (iVar2 != 0) goto LAB_0010775a;
      iVar2 = ioctl(local_22b8,0x3b65,1);
      if (iVar2 == 1) goto LAB_0010762d;
      goto LAB_00107764;
    }
LAB_0010762d:
    snprintf(local_1018,0x1000,"/dev/vfio/%d",(ulong)local_22b4);
    iVar2 = open(local_1018,2);
    if (iVar2 == -1) goto LAB_0010771e;
    local_22b0 = 8;
    iVar3 = ioctl(iVar2,0x3b67);
    if (iVar3 == -1) goto LAB_00107728;
    if ((local_22b0 & 0x100000000) == 0) goto LAB_00107732;
    iVar3 = ioctl(iVar2,0x3b68,&local_22b8);
    if (iVar3 == -1) goto LAB_0010773c;
    if ((iVar1 != -1) || (iVar1 = ioctl(local_22b8,0x3b66,1), iVar1 != -1)) {
      iVar1 = ioctl(iVar2,0x3b6a,pci_addr);
      if (iVar1 != -1) {
        vfio_enable_dma(iVar1);
        return iVar1;
      }
      goto LAB_00107746;
    }
  }
  iVar1 = (int)local_22a8;
  vfio_init_cold_4();
  iVar2 = ioctl(iVar1,0x3b6c);
  if (iVar2 != -1) {
    pvVar7 = mmap((void *)0x0,0,3,1,iVar1,0);
    if (pvVar7 != (void *)0xffffffffffffffff) goto LAB_001077dd;
    vfio_map_region_cold_1();
  }
  pvVar7 = (void *)0xffffffffffffffff;
LAB_001077dd:
  return (int)pvVar7;
}

Assistant:

int vfio_init(const char* pci_addr) {
	// find iommu group for the device
	// `readlink /sys/bus/pci/device/<segn:busn:devn.funcn>/iommu_group`
	char path[PATH_MAX], iommu_group_path[PATH_MAX];
	struct stat st;
	snprintf(path, sizeof(path), "/sys/bus/pci/devices/%s/", pci_addr);
	int ret = stat(path, &st);
	if (ret < 0) {
		// No such device
		return -1;
	}
	strncat(path, "iommu_group", sizeof(path) - strlen(path) - 1);

	int len = check_err(readlink(path, iommu_group_path, sizeof(iommu_group_path)), "find the iommu_group for the device");

	iommu_group_path[len] = '\0'; // append 0x00 to the string to end it
	char* group_name = basename(iommu_group_path);
	int groupid;
	check_err(sscanf(group_name, "%d", &groupid), "convert group id to int");

	int firstsetup = 0; // Need to set up the container exactly once
	int cfd = get_vfio_container();
	if (cfd == -1) {
		firstsetup = 1;
		// open vfio file to create new vfio container
		cfd = check_err(open("/dev/vfio/vfio", O_RDWR), "open /dev/vfio/vfio");
		set_vfio_container(cfd);

		// check if the container's API version is the same as the VFIO API's
		check_err((ioctl(cfd, VFIO_GET_API_VERSION) == VFIO_API_VERSION) - 1, "get a valid API version from the container");

		// check if type1 is supported
		check_err((ioctl(cfd, VFIO_CHECK_EXTENSION, VFIO_TYPE1_IOMMU) == 1) - 1, "get Type1 IOMMU support from the IOMMU container");
	}

	// open VFIO group containing the device
	snprintf(path, sizeof(path), "/dev/vfio/%d", groupid);
	int vfio_gfd = check_err(open(path, O_RDWR), "open vfio group");

	// check if group is viable
	struct vfio_group_status group_status = {.argsz = sizeof(group_status)};
	check_err(ioctl(vfio_gfd, VFIO_GROUP_GET_STATUS, &group_status), "get VFIO group status");
	check_err(((group_status.flags & VFIO_GROUP_FLAGS_VIABLE) > 0) - 1, "get viable VFIO group - are all devices in the group bound to the VFIO driver?");

	// Add group to container
	check_err(ioctl(vfio_gfd, VFIO_GROUP_SET_CONTAINER, &cfd), "set container");

	if (firstsetup != 0) {
		// Set vfio type (type1 is for IOMMU like VT-d or AMD-Vi) for the
		// container.
		// This can only be done after at least one group is in the container.
		ret = check_err(ioctl(cfd, VFIO_SET_IOMMU, VFIO_TYPE1_IOMMU), "set IOMMU type");
	}

	// get device file descriptor
	int vfio_fd = check_err(ioctl(vfio_gfd, VFIO_GROUP_GET_DEVICE_FD, pci_addr), "get device fd");

	// enable DMA
	vfio_enable_dma(vfio_fd);

	return vfio_fd;
}